

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_flt3_ldst(DisasContext_conflict6 *ctx,uint32_t opc,int fd,int fs,int base,int index)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 t;
  TCGv_i64 t_00;
  int reg;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  t = tcg_temp_new_i64(tcg_ctx);
  reg = index;
  if ((base == 0) || (reg = base, index == 0)) {
    gen_load_gpr(tcg_ctx,t,reg);
  }
  else {
    gen_op_addr_add(ctx,t,tcg_ctx->cpu_gpr[(uint)base],tcg_ctx->cpu_gpr[(uint)index]);
  }
  switch(opc) {
  case 0x4c000000:
    check_cop1x(ctx);
    t_00 = (TCGv_i64)tcg_temp_new_i32(tcg_ctx);
    tcg_gen_qemu_ld_i64_mips64el(tcg_ctx,t,t,(long)ctx->mem_idx,MO_LESL);
    tcg_gen_extrl_i64_i32_mips64el(tcg_ctx,(TCGv_i32)t_00,t);
    gen_store_fpr32(ctx,(TCGv_i32)t_00,fd);
    break;
  case 0x4c000001:
    check_cop1x(ctx);
    check_cp1_registers(ctx,fd);
    t_00 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_qemu_ld_i64_mips64el(tcg_ctx,t_00,t,(long)ctx->mem_idx,MO_64);
    goto LAB_0088713d;
  default:
    goto switchD_00887039_caseD_4c000002;
  case 0x4c000005:
    check_cp1_64bitmode(ctx);
    tcg_gen_andi_i64_mips64el(tcg_ctx,t,t,-8);
    t_00 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_qemu_ld_i64_mips64el(tcg_ctx,t_00,t,(long)ctx->mem_idx,MO_64);
LAB_0088713d:
    gen_store_fpr64(ctx,t_00,fd);
    break;
  case 0x4c000008:
    check_cop1x(ctx);
    t_00 = (TCGv_i64)tcg_temp_new_i32(tcg_ctx);
    gen_load_fpr32(ctx,(TCGv_i32)t_00,fs);
    tcg_gen_qemu_st_i32_mips64el(tcg_ctx,(TCGv_i32)t_00,t,(long)ctx->mem_idx,MO_32);
    break;
  case 0x4c000009:
    check_cop1x(ctx);
    check_cp1_registers(ctx,fs);
    t_00 = tcg_temp_new_i64(tcg_ctx);
    goto LAB_008871a5;
  case 0x4c00000d:
    check_cp1_64bitmode(ctx);
    tcg_gen_andi_i64_mips64el(tcg_ctx,t,t,-8);
    t_00 = tcg_temp_new_i64(tcg_ctx);
LAB_008871a5:
    gen_load_fpr64(ctx,t_00,fs);
    tcg_gen_qemu_st_i64_mips64el(tcg_ctx,t_00,t,(long)ctx->mem_idx,MO_64);
  }
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)((TCGv_i32)t_00 + (long)tcg_ctx));
switchD_00887039_caseD_4c000002:
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_flt3_ldst(DisasContext *ctx, uint32_t opc,
                          int fd, int fs, int base, int index)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);

    if (base == 0) {
        gen_load_gpr(tcg_ctx, t0, index);
    } else if (index == 0) {
        gen_load_gpr(tcg_ctx, t0, base);
    } else {
        gen_op_addr_add(ctx, t0, tcg_ctx->cpu_gpr[base], tcg_ctx->cpu_gpr[index]);
    }
    /*
     * Don't do NOP if destination is zero: we must perform the actual
     * memory access.
     */
    switch (opc) {
    case OPC_LWXC1:
        check_cop1x(ctx);
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);

            tcg_gen_qemu_ld_tl(tcg_ctx, t0, t0, ctx->mem_idx, MO_TESL);
            tcg_gen_trunc_tl_i32(tcg_ctx, fp0, t0);
            gen_store_fpr32(ctx, fp0, fd);
            tcg_temp_free_i32(tcg_ctx, fp0);
        }
        break;
    case OPC_LDXC1:
        check_cop1x(ctx);
        check_cp1_registers(ctx, fd);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_qemu_ld_i64(tcg_ctx, fp0, t0, ctx->mem_idx, MO_TEQ);
            gen_store_fpr64(ctx, fp0, fd);
            tcg_temp_free_i64(tcg_ctx, fp0);
        }
        break;
    case OPC_LUXC1:
        check_cp1_64bitmode(ctx);
        tcg_gen_andi_tl(tcg_ctx, t0, t0, ~0x7);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);

            tcg_gen_qemu_ld_i64(tcg_ctx, fp0, t0, ctx->mem_idx, MO_TEQ);
            gen_store_fpr64(ctx, fp0, fd);
            tcg_temp_free_i64(tcg_ctx, fp0);
        }
        break;
    case OPC_SWXC1:
        check_cop1x(ctx);
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);
            gen_load_fpr32(ctx, fp0, fs);
            tcg_gen_qemu_st_i32(tcg_ctx, fp0, t0, ctx->mem_idx, MO_TEUL);
            tcg_temp_free_i32(tcg_ctx, fp0);
        }
        break;
    case OPC_SDXC1:
        check_cop1x(ctx);
        check_cp1_registers(ctx, fs);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            gen_load_fpr64(ctx, fp0, fs);
            tcg_gen_qemu_st_i64(tcg_ctx, fp0, t0, ctx->mem_idx, MO_TEQ);
            tcg_temp_free_i64(tcg_ctx, fp0);
        }
        break;
    case OPC_SUXC1:
        check_cp1_64bitmode(ctx);
        tcg_gen_andi_tl(tcg_ctx, t0, t0, ~0x7);
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            gen_load_fpr64(ctx, fp0, fs);
            tcg_gen_qemu_st_i64(tcg_ctx, fp0, t0, ctx->mem_idx, MO_TEQ);
            tcg_temp_free_i64(tcg_ctx, fp0);
        }
        break;
    }
    tcg_temp_free(tcg_ctx, t0);
}